

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,hex_writer f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  f_00;
  wchar_t wVar1;
  alignment aVar2;
  uint uVar3;
  int iVar4;
  alignment aVar5;
  size_t sVar6;
  size_t in_RCX;
  align_spec *in_RDX;
  uint in_ESI;
  basic_format_specs<char> *in_R8;
  undefined1 in_stack_00000008 [12];
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  undefined7 in_stack_ffffffffffffff91;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 uVar7;
  long lVar8;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar9;
  basic_string_view<char> local_10;
  
  local_10.data_ = (char *)in_RDX;
  local_10.size_ = in_RCX;
  sVar6 = basic_string_view<char>::size(&local_10);
  wVar1 = align_spec::fill(&in_R8->super_align_spec);
  uVar9 = (undefined1)wVar1;
  lVar8 = 0;
  aVar2 = align_spec::align(&in_R8->super_align_spec);
  if (aVar2 == ALIGN_NUMERIC) {
    uVar3 = align_spec::width(&in_R8->super_align_spec);
    if (sVar6 + in_ESI < (ulong)uVar3) {
      uVar3 = align_spec::width(&in_R8->super_align_spec);
      lVar8 = (ulong)uVar3 - (sVar6 + in_ESI);
      align_spec::width(&in_R8->super_align_spec);
    }
  }
  else {
    iVar4 = basic_format_specs<char>::precision(in_R8);
    if ((int)in_ESI < iVar4) {
      basic_string_view<char>::size(&local_10);
      basic_format_specs<char>::precision(in_R8);
      iVar4 = basic_format_specs<char>::precision(in_R8);
      lVar8 = (long)iVar4 - (ulong)in_ESI;
      uVar9 = 0x30;
    }
  }
  uVar7._0_4_ = (in_R8->super_align_spec).width_;
  uVar7._4_4_ = (in_R8->super_align_spec).fill_;
  aVar2 = (in_R8->super_align_spec).align_;
  aVar5 = align_spec::align(&in_R8->super_align_spec);
  if (aVar5 == ALIGN_DEFAULT) {
    aVar2 = ALIGN_RIGHT;
  }
  f_00.prefix.size_._4_4_ = in_stack_ffffffffffffffac;
  f_00.prefix._0_12_ = in_stack_00000008;
  f_00._16_4_ = in_stack_ffffffffffffffb0;
  f_00._20_8_ = uVar7;
  f_00.padding._4_4_ = aVar2;
  f_00.f.self = (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *)lVar8;
  f_00.f._8_7_ = in_stack_ffffffffffffffc8;
  f_00.f._15_1_ = uVar9;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             CONCAT71(in_stack_ffffffffffffff91,uVar9),local_10.size_,(align_spec *)local_10.data_,
             f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }